

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O3

void DwaCompressor_destroy(DwaCompressor *me)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  ChannelData *ptr;
  Classifier *ptr_00;
  int i;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (me->_packedAcBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_packedAcBuffer);
  }
  if (me->_packedDcBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_packedDcBuffer);
  }
  if (me->_rleBuffer != (uint8_t *)0x0) {
    internal_exr_free(me->_rleBuffer);
  }
  ptr = me->_channelData;
  if (ptr != (ChannelData *)0x0) {
    iVar2 = me->_numChannels;
    if (0 < iVar2) {
      lVar4 = 0x1a0;
      lVar5 = 0;
      do {
        pvVar1 = *(void **)((long)(me->_channelData->_dctData)._dctData + lVar4 + -0x20);
        if (pvVar1 != (void *)0x0) {
          internal_exr_free(pvVar1);
          iVar2 = me->_numChannels;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x240;
      } while (lVar5 < iVar2);
      ptr = me->_channelData;
    }
    internal_exr_free(ptr);
  }
  if (me->_cscChannelSets != (CscChannelSet *)0x0) {
    internal_exr_free(me->_cscChannelSets);
  }
  ptr_00 = me->_channelRules;
  if (ptr_00 != sDefaultChannelRules && ptr_00 != sLegacyChannelRules) {
    uVar3 = me->_channelRuleCount;
    if (uVar3 != 0) {
      lVar4 = 0;
      uVar6 = 0;
      do {
        pvVar1 = *(void **)((long)&me->_channelRules->_suffix + lVar4);
        if ((pvVar1 != (void *)0x0) && ((&me->_channelRules->_stringStatic)[lVar4] == '\0')) {
          internal_exr_free(pvVar1);
          uVar3 = me->_channelRuleCount;
        }
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar6 < uVar3);
      ptr_00 = me->_channelRules;
    }
    internal_exr_free(ptr_00);
  }
  lVar4 = 0;
  do {
    if (me->_planarUncBuffer[lVar4] != (uint8_t *)0x0) {
      internal_exr_free(me->_planarUncBuffer[lVar4]);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

static void
DwaCompressor_destroy (DwaCompressor* me)
{
    if (me->_packedAcBuffer) internal_exr_free (me->_packedAcBuffer);
    if (me->_packedDcBuffer) internal_exr_free (me->_packedDcBuffer);
    if (me->_rleBuffer) internal_exr_free (me->_rleBuffer);

    if (me->_channelData)
    {
        for (int c = 0; c < me->_numChannels; ++c)
            DctCoderChannelData_destroy (&(me->_channelData[c]._dctData));

        internal_exr_free (me->_channelData);
    }

    if (me->_cscChannelSets) internal_exr_free (me->_cscChannelSets);
    if (me->_channelRules != sLegacyChannelRules &&
        me->_channelRules != sDefaultChannelRules)
    {
        for (size_t i = 0; i < me->_channelRuleCount; ++i)
            Classifier_destroy (&(me->_channelRules[i]));
        internal_exr_free (me->_channelRules);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (me->_planarUncBuffer[i])
            internal_exr_free (me->_planarUncBuffer[i]);
    }
}